

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Spc_Emu::set_sample_rate_(Spc_Emu *this,long sample_rate)

{
  int iVar1;
  undefined4 extraout_var;
  blargg_err_t pcVar2;
  
  iVar1 = Snes_Spc::init(&this->apu,(EVP_PKEY_CTX *)sample_rate);
  pcVar2 = (blargg_err_t)CONCAT44(extraout_var,iVar1);
  if (pcVar2 == (blargg_err_t)0x0) {
    (*(this->super_Music_Emu).super_Gme_File._vptr_Gme_File[0xc])(this,0);
    if (sample_rate != 32000) {
      pcVar2 = Fir_Resampler_::buffer_size(&(this->resampler).super_Fir_Resampler_,0xc80);
      if (pcVar2 != (blargg_err_t)0x0) {
        return pcVar2;
      }
      Fir_Resampler_::time_ratio
                (&(this->resampler).super_Fir_Resampler_,32000.0 / (double)sample_rate,0.9965,1.0);
    }
    pcVar2 = (blargg_err_t)0x0;
  }
  return pcVar2;
}

Assistant:

blargg_err_t Spc_Emu::set_sample_rate_( long sample_rate )
{
	RETURN_ERR( apu.init() );
	enable_accuracy( false );
	if ( sample_rate != native_sample_rate )
	{
		RETURN_ERR( resampler.buffer_size( native_sample_rate / 20 * 2 ) );
		resampler.time_ratio( (double) native_sample_rate / sample_rate, 0.9965 );
	}
	return 0;
}